

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O0

void __thiscall
ins_ekf::InsEkf::ProcessMeasurement
          (InsEkf *this,vector<double,_std::allocator<double>_> *measurement,double dt)

{
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  size_type sVar1;
  size_t sVar2;
  const_reference pvVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar4;
  double *pdVar5;
  double local_1e8;
  Type local_1e0;
  Type local_1a8;
  Stride<0,_0> local_16a;
  EigenBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_168 [24];
  undefined1 local_150 [8];
  VectorXd gps_meas;
  Type local_108;
  Vector3d local_d0;
  Vector3d local_b8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_a0;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_70;
  undefined1 local_50 [8];
  Vector3d axyz_meas;
  Vector3d pqr_meas;
  double dt_local;
  vector<double,_std::allocator<double>_> *measurement_local;
  InsEkf *this_local;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(measurement);
  sVar2 = m_I(NUM_MEASUREMENTS);
  if (sVar1 == sVar2) {
    this_00 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              (axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_00);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_50);
    sVar2 = m_I(p);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](measurement,sVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<(&local_70,this_00,pvVar3);
    sVar2 = m_I(q);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](measurement,sVar2);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_70,pvVar3);
    sVar2 = m_I(r);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](measurement,sVar2);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,pvVar3);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_70);
    sVar2 = m_I(ax);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](measurement,sVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_a0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_50,pvVar3);
    sVar2 = m_I(ay);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](measurement,sVar2);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_a0,pvVar3);
    sVar2 = m_I(az);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](measurement,sVar2);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,pvVar3);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_a0);
    RotateVectByQuat(&local_b8,&this->imu_orientation_,
                     (Vector3d *)
                     (axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),&local_b8);
    RotateVectByQuat(&local_d0,&this->imu_orientation_,(Vector3d *)local_50);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_50,&local_d0);
    sVar2 = m_I(p);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::segment<int>
              (&local_108,
               (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_,sVar2
               ,3);
    Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false> *)&local_108,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    sVar2 = m_I(ax);
    Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::segment<int>
              ((Type *)&gps_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows,
               (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_,sVar2
               ,3);
    Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false> *)
               &gps_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_50);
    if (ProcessMeasurement::t_since_last_gps < this->gps_update_rate_) {
      sVar2 = m_I(gpsX);
      Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::segment<int>
                (&local_1e0,
                 (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_,
                 sVar2,5);
      local_1e8 = nan("");
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1,_1,_false>_>::
      setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>_> *)
                  &local_1e0,&local_1e8);
      ProcessMeasurement::t_since_last_gps = dt + ProcessMeasurement::t_since_last_gps;
    }
    else {
      pdVar5 = std::vector<double,_std::allocator<double>_>::data(measurement);
      Eigen::Stride<0,_0>::Stride(&local_16a);
      Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
                ((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_168,pdVar5 + 6,5,&local_16a);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                ((Matrix<double,_1,1,0,_1,1> *)local_150,local_168);
      sVar2 = m_I(gpsX);
      Eigen::DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>::segment<int>
                (&local_1a8,
                 (DenseBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *)&this->last_measurements_,
                 sVar2,5);
      Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false> *)&local_1a8,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_150);
      ProcessMeasurement::t_since_last_gps = 0.0;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_150);
    }
    return;
  }
  __assert_fail("measurement.size() == m_I(MI::NUM_MEASUREMENTS)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/KWoiceshyn[P]ins_ekf/src/ins_ekf.cpp"
                ,0x2a,
                "void ins_ekf::InsEkf::ProcessMeasurement(const std::vector<double> &, double)");
}

Assistant:

void InsEkf::ProcessMeasurement(const std::vector<double>& measurement, double dt) {

        static double t_since_last_gps = 0.0;
        assert(measurement.size() == m_I(MI::NUM_MEASUREMENTS));

        Eigen::Vector3d pqr_meas, axyz_meas;
        pqr_meas << measurement[m_I(MI::p)], measurement[m_I(MI::q)], measurement[m_I(MI::r)];
        axyz_meas << measurement[m_I(MI::ax)], measurement[m_I(MI::ay)], measurement[m_I(MI::az)];

        // transform measurements from sensor frame to vehicle body frame
        pqr_meas = RotateVectByQuat(imu_orientation_, pqr_meas);
        axyz_meas = RotateVectByQuat(imu_orientation_, axyz_meas);

        last_measurements_.segment(m_I(MI::p), 3) = pqr_meas;
        last_measurements_.segment(m_I(MI::ax), 3) = axyz_meas;

        // capture GPS measurements if they are available
        if(t_since_last_gps >= gps_update_rate_){
            const Eigen::VectorXd gps_meas = Eigen::Map<const Eigen::VectorXd>(measurement.data() + 6, 5);
            last_measurements_.segment(m_I(MI::gpsX), 5) = gps_meas;
            t_since_last_gps = 0;
        }else {
            last_measurements_.segment(m_I(MI::gpsX), 5).setConstant(std::nan(""));
            t_since_last_gps += dt;
        }
    }